

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_buffer_file(uchar *out,size_t size,char *filename)

{
  uint uVar1;
  FILE *__stream;
  size_t sVar2;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    uVar1 = 0x4e;
  }
  else {
    sVar2 = fread(out,1,size,__stream);
    fclose(__stream);
    uVar1 = 0x4e;
    if (sVar2 == size) {
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

static unsigned lodepng_buffer_file(unsigned char* out, size_t size, const char* filename)
{
  FILE* file;
  size_t readsize;
  file = fopen(filename, "rb");
  if(!file) return 78;

  readsize = fread(out, 1, size, file);
  fclose(file);

  if (readsize != size) return 78;
  return 0;
}